

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Clock.cxx
# Opt level: O0

void __thiscall Fl_Clock_Output::value(Fl_Clock_Output *this,int H,int m,int s)

{
  int s_local;
  int m_local;
  int H_local;
  Fl_Clock_Output *this_local;
  
  if (((H != this->hour_) || (m != this->minute_)) || (s != this->second_)) {
    this->hour_ = H;
    this->minute_ = m;
    this->second_ = s;
    this->value_ = (long)((H * 0x3c + m) * 0x3c + s);
    Fl_Widget::damage(&this->super_Fl_Widget,'\x01');
  }
  return;
}

Assistant:

void Fl_Clock_Output::value(int H, int m, int s) {
  if (H!=hour_ || m!=minute_ || s!=second_) {
    hour_ = H; minute_ = m; second_ = s;
    value_ = (H * 60 + m) * 60 + s;
    damage(FL_DAMAGE_CHILD);
  }
}